

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int exprNodeCanReturnSubtype(Walker *pWalker,Expr *pExpr)

{
  sqlite3 *db;
  FuncDef *pFVar1;
  int nArg;
  
  if (pExpr->op == 0xac) {
    db = pWalker->pParse->db;
    if ((pExpr->x).pList == (ExprList *)0x0) {
      nArg = 0;
    }
    else {
      nArg = ((pExpr->x).pList)->nExpr;
    }
    pFVar1 = sqlite3FindFunction(db,(pExpr->u).zToken,nArg,db->enc,'\0');
    if ((pFVar1 != (FuncDef *)0x0) && ((pFVar1->funcFlags & 0x1000000) == 0)) {
      return 0;
    }
    pWalker->eCode = 1;
  }
  return 1;
}

Assistant:

static int exprNodeCanReturnSubtype(Walker *pWalker, Expr *pExpr){
  int n;
  FuncDef *pDef;
  sqlite3 *db;
  if( pExpr->op!=TK_FUNCTION ){
    return WRC_Prune;
  }
  assert( ExprUseXList(pExpr) );
  db = pWalker->pParse->db;
  n = ALWAYS(pExpr->x.pList) ? pExpr->x.pList->nExpr : 0;
  pDef = sqlite3FindFunction(db, pExpr->u.zToken, n, ENC(db), 0);
  if( NEVER(pDef==0) || (pDef->funcFlags & SQLITE_RESULT_SUBTYPE)!=0 ){
    pWalker->eCode = 1;
    return WRC_Prune;
  }
  return WRC_Continue;
}